

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

bool __thiscall rlist::listDelNode(rlist *this,int pos)

{
  unsigned_long uVar1;
  int local_2c;
  int i;
  long tmp;
  int pos_local;
  rlist *this_local;
  
  uVar1 = listLength(this);
  if ((long)(pos + -1) < (long)uVar1) {
    this->view = this->rl->head;
    for (local_2c = 0; local_2c != pos + -1; local_2c = local_2c + 1) {
      this->view = this->view->next;
    }
    _free(this,this->view);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool rlist::listDelNode(int pos){
    long tmp=rlist::listLength();
    pos--;
    if(tmp>pos){
        view=rl->head;
        for(int i=0;i!=pos;i++)
            view=view->next;
        rlist::_free((void *)view);
        return true;
    } 
    return false;
}